

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall
WavingSketch<8U,_16U,_4U>::WavingSketch
          (WavingSketch<8U,_16U,_4U> *this,int mem,int _HIT,uint32_t _HASH_NUM)

{
  void *pvVar1;
  Bucket *this_00;
  _func_int **pp_Var2;
  clock_t cVar3;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  Abstract<4U> *in_RDI;
  undefined8 in_stack_ffffffffffffff98;
  Abstract<4U> *in_stack_ffffffffffffffa0;
  _func_int **pp_Var4;
  _func_int **local_58;
  
  Abstract<4U>::Abstract(in_stack_ffffffffffffffa0);
  in_RDI->_vptr_Abstract = (_func_int **)&PTR_Init_00123ad8;
  *(int *)&in_RDI[1].name = (int)((ulong)(long)in_ESI / 0x60);
  *(undefined4 *)&in_RDI[1].field_0xc = in_ECX;
  *(int *)&in_RDI[1].field_0x10 = (in_ESI << 3) >> 1;
  *(undefined4 *)&in_RDI[1].cr = 0;
  in_RDI->HIT = in_EDX;
  std::__cxx11::string::operator=((string *)&in_RDI->name,"WavingSketch");
  *(undefined4 *)&in_RDI[1].field_0x20 = 0;
  pvVar1 = operator_new(0x10);
  BitSet::BitSet((BitSet *)in_stack_ffffffffffffffa0,
                 (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  *(void **)&in_RDI[1].field_0x18 = pvVar1;
  this_00 = (Bucket *)(ulong)*(uint *)&in_RDI[1].name;
  pp_Var2 = (_func_int **)operator_new__((long)this_00 * 0x60);
  if (this_00 != (Bucket *)0x0) {
    pp_Var4 = pp_Var2 + (long)this_00 * 0xc;
    local_58 = pp_Var2;
    do {
      Bucket::Bucket(this_00);
      local_58 = local_58 + 0xc;
    } while (local_58 != pp_Var4);
  }
  in_RDI[1]._vptr_Abstract = pp_Var2;
  memset(in_RDI[1]._vptr_Abstract,0,(ulong)*(uint *)&in_RDI[1].name * 0x60);
  Abstract<4U>::rename(in_RDI,(char *)0x8,(char *)0x10);
  std::__cxx11::string::operator=((string *)&in_RDI->sep,"\t");
  cVar3 = clock();
  *(int *)&in_RDI[1].field_0x24 = (int)cVar3;
  sleep(1);
  cVar3 = clock();
  *(int *)((long)&in_RDI[1].pr + 4) = (int)cVar3;
  sleep(1);
  cVar3 = clock();
  *(int *)&in_RDI[1].pr = (int)cVar3;
  return;
}

Assistant:

WavingSketch(int mem, int _HIT, uint32_t _HASH_NUM = 3)
		: BUCKET_NUM(mem / sizeof(Bucket)),
		HASH_NUM(_HASH_NUM),
		LENGTH(mem * 8 * 1 / 2),
		cnt(0)
	{
		this->HIT = _HIT;
		this->name = (char*)"WavingSketch";
		record = 0;
		bitset = new BitSet(LENGTH);
		buckets = new Bucket[BUCKET_NUM];
		memset(buckets, 0, BUCKET_NUM * sizeof(Bucket));
		this->rename(int(slot_num), int(counter_num));
		this->sep = "\t";
		seed_choice = std::clock();
		sleep(1);
		seed_incast = std::clock();
		sleep(1);
		seed_s = std::clock();
		// std::printf("seed_choice: %d, seed_incast: %d, seed_s: %d\n",
		// seed_choice, seed_incast, seed_s);
	}